

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void update_fb_of_context_type(AV1_COMP *cpi,int *fb_of_context_type)

{
  int iVar1;
  int iVar2;
  AV1_COMMON *cm_00;
  long in_RSI;
  AV1_COMP *in_RDI;
  int i_1;
  int i;
  int current_frame_ref_type;
  AV1_COMMON *cm;
  int local_28;
  int local_24;
  int local_20;
  
  cm_00 = &in_RDI->common;
  iVar1 = get_current_frame_ref_type(in_RDI);
  iVar2 = frame_is_intra_only(cm_00);
  if (((iVar2 != 0) || (((in_RDI->common).features.error_resilient_mode & 1U) != 0)) ||
     (((in_RDI->ext_flags).use_primary_ref_none & 1U) != 0)) {
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      *(undefined4 *)(in_RSI + (long)local_20 * 4) = 0xffffffff;
    }
    if ((in_RDI->common).show_frame == 0) {
      local_28 = get_ref_frame_map_idx(cm_00,'\a');
    }
    else {
      local_28 = get_ref_frame_map_idx(cm_00,'\x04');
    }
    *(int *)(in_RSI + (long)iVar1 * 4) = local_28;
  }
  iVar2 = encode_show_existing_frame(cm_00);
  if (iVar2 == 0) {
    if ((cm_00->current_frame).frame_type == '\0') {
      *(undefined4 *)(in_RSI + (long)iVar1 * 4) = 0;
    }
    else {
      for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
        if (((in_RDI->common).current_frame.refresh_frame_flags & 1 << ((byte)local_24 & 0x1f)) != 0
           ) {
          *(int *)(in_RSI + (long)iVar1 * 4) = local_24;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void update_fb_of_context_type(const AV1_COMP *const cpi,
                                      int *const fb_of_context_type) {
  const AV1_COMMON *const cm = &cpi->common;
  const int current_frame_ref_type = get_current_frame_ref_type(cpi);

  if (frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
      cpi->ext_flags.use_primary_ref_none) {
    for (int i = 0; i < REF_FRAMES; i++) {
      fb_of_context_type[i] = -1;
    }
    fb_of_context_type[current_frame_ref_type] =
        cm->show_frame ? get_ref_frame_map_idx(cm, GOLDEN_FRAME)
                       : get_ref_frame_map_idx(cm, ALTREF_FRAME);
  }

  if (!encode_show_existing_frame(cm)) {
    // Refresh fb_of_context_type[]: see encoder.h for explanation
    if (cm->current_frame.frame_type == KEY_FRAME) {
      // All ref frames are refreshed, pick one that will live long enough
      fb_of_context_type[current_frame_ref_type] = 0;
    } else {
      // If more than one frame is refreshed, it doesn't matter which one we
      // pick so pick the first.  LST sometimes doesn't refresh any: this is ok

      for (int i = 0; i < REF_FRAMES; i++) {
        if (cm->current_frame.refresh_frame_flags & (1 << i)) {
          fb_of_context_type[current_frame_ref_type] = i;
          break;
        }
      }
    }
  }
}